

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

edge_t_conflict
create_edge(gen_ctx_t gen_ctx,bb_t_conflict src,bb_t_conflict dst,int fall_through_p,int append_p)

{
  DLIST_in_edge_t *list;
  in_edge_t peVar1;
  in_edge_t_conflict elem;
  out_edge_t peVar2;
  DLIST_out_edge_t *pDVar3;
  DLIST_LINK_out_edge_t *pDVar4;
  char *op;
  DLIST_LINK_in_edge_t *pDVar5;
  
  elem = (in_edge_t_conflict)gen_malloc(gen_ctx,0x38);
  list = &dst->in_edges;
  elem->src = src;
  elem->dst = dst;
  if (append_p == 0) {
    peVar1 = list->head;
    if (peVar1 == (in_edge_t)0x0) {
      if ((dst->in_edges).tail != (in_edge_t_conflict)0x0) goto LAB_00136ff5;
      pDVar5 = (DLIST_LINK_in_edge_t *)&(dst->in_edges).tail;
    }
    else {
      if ((peVar1->in_link).prev != (in_edge_t)0x0) {
LAB_00136ff5:
        dlist_assert_fail("prepend","in_edge_t");
      }
      pDVar5 = &peVar1->in_link;
    }
    pDVar5->prev = elem;
    (elem->in_link).prev = (in_edge_t)0x0;
    (elem->in_link).next = peVar1;
    list->head = elem;
    peVar2 = (src->out_edges).head;
    if (peVar2 == (out_edge_t)0x0) {
      if ((src->out_edges).tail != (out_edge_t)0x0) goto LAB_00137008;
      pDVar4 = (DLIST_LINK_out_edge_t *)&(src->out_edges).tail;
    }
    else {
      if ((peVar2->out_link).prev != (out_edge_t)0x0) {
LAB_00137008:
        op = "prepend";
        goto LAB_0013700f;
      }
      pDVar4 = &peVar2->out_link;
    }
    pDVar4->prev = elem;
    (elem->out_link).prev = (out_edge_t)0x0;
    pDVar3 = &src->out_edges;
    (elem->out_link).next = peVar2;
    goto LAB_00136fd1;
  }
  DLIST_in_edge_t_append(list,elem);
  peVar2 = (src->out_edges).tail;
  if (peVar2 == (out_edge_t)0x0) {
    if ((src->out_edges).head != (out_edge_t)0x0) goto LAB_00136fec;
    pDVar3 = &src->out_edges;
  }
  else {
    if ((peVar2->out_link).next != (out_edge_t)0x0) {
LAB_00136fec:
      op = "append";
LAB_0013700f:
      dlist_assert_fail(op,"out_edge_t");
    }
    pDVar3 = (DLIST_out_edge_t *)&(peVar2->out_link).next;
  }
  pDVar3->head = elem;
  (elem->out_link).next = (out_edge_t)0x0;
  pDVar3 = (DLIST_out_edge_t *)&(src->out_edges).tail;
  (elem->out_link).prev = peVar2;
LAB_00136fd1:
  pDVar3->head = elem;
  elem->fall_through_p = (uchar)fall_through_p;
  elem->flag2 = '\0';
  elem->back_edge_p = '\0';
  elem->flag1 = '\0';
  return peVar2;
}

Assistant:

static edge_t create_edge (gen_ctx_t gen_ctx, bb_t src, bb_t dst, int fall_through_p,
                           int append_p) {
  edge_t e = gen_malloc (gen_ctx, sizeof (struct edge));

  e->src = src;
  e->dst = dst;
  if (append_p) {
    DLIST_APPEND (in_edge_t, dst->in_edges, e);
    DLIST_APPEND (out_edge_t, src->out_edges, e);
  } else {
    DLIST_PREPEND (in_edge_t, dst->in_edges, e);
    DLIST_PREPEND (out_edge_t, src->out_edges, e);
  }
  e->fall_through_p = fall_through_p;
  e->back_edge_p = e->flag1 = e->flag2 = FALSE;
  return e;
}